

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTreeErrorReporter.cpp
# Opt level: O1

void __thiscall
DOMTreeErrorReporter::fatalError(DOMTreeErrorReporter *this,SAXParseException *toCatch)

{
  wchar16 *pwVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  StrX local_30;
  StrX local_28;
  
  this->fSawErrors = true;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Fatal Error at file \"",0x15);
  pwVar1 = (wchar16 *)xercesc_4_0::SAXParseException::getSystemId();
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_28.fLocalForm = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1091c0);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\", line ",8);
  xercesc_4_0::SAXParseException::getLineNumber();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", column ",9);
  xercesc_4_0::SAXParseException::getColumnNumber();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n   Message: ",0xd);
  pwVar1 = (wchar16 *)(**(code **)(*(long *)toCatch + 0x10))(toCatch);
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_30.fLocalForm = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  StrX::~StrX(&local_30);
  StrX::~StrX(&local_28);
  return;
}

Assistant:

void DOMTreeErrorReporter::fatalError(const SAXParseException& toCatch)
{
    fSawErrors = true;
    std::cerr << "Fatal Error at file \"" << StrX(toCatch.getSystemId())
		 << "\", line " << toCatch.getLineNumber()
		 << ", column " << toCatch.getColumnNumber()
         << "\n   Message: " << StrX(toCatch.getMessage()) << std::endl;
}